

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear_hash.c
# Opt level: O2

ion_status_t linear_hash_get(ion_byte_t *key,ion_byte_t *value,linear_hash_table_t *linear_hash)

{
  int iVar1;
  int iVar2;
  FILE *pFVar3;
  ion_dictionary_compare_t p_Var4;
  undefined8 bucket_loc;
  byte bVar5;
  bool bVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  char *__dest;
  void *__dest_00;
  ulong uVar10;
  size_t sVar11;
  ion_fpos_t iVar12;
  void *__s;
  long lVar13;
  undefined8 uStack_a0;
  char acStack_98 [8];
  undefined1 local_90 [8];
  linear_hash_bucket_t bucket;
  
  uStack_a0 = 0x112f94;
  iVar8 = insert_hash_to_bucket(key,linear_hash);
  if (iVar8 < linear_hash->next_split) {
    uStack_a0 = 0x112fa7;
    iVar8 = hash_to_bucket(key,linear_hash);
  }
  if (iVar8 < linear_hash->bucket_map->current_size) {
    iVar12 = linear_hash->bucket_map->data[iVar8];
  }
  else {
    iVar12 = -1;
  }
  uStack_a0 = 0x112fd1;
  bVar5 = linear_hash_get_bucket(iVar12,(linear_hash_bucket_t *)local_90,linear_hash);
  uVar9 = 0;
  if (bVar5 == 0) {
    __dest = acStack_98 + -((long)(linear_hash->super).record.key_size + 0xfU & 0xfffffffffffffff0);
    __dest_00 = __dest + -((long)(linear_hash->super).record.value_size + 0xfU & 0xfffffffffffffff0)
    ;
    sVar11 = (long)linear_hash->records_per_bucket * linear_hash->record_total_size;
    __s = (void *)((long)__dest_00 - (sVar11 + 0xf & 0xfffffffffffffff0));
    *(undefined8 *)((long)__s + -8) = 0x11303f;
    memset(__s,0,sVar11);
    do {
      bucket_loc = bucket._0_8_;
      bucket.overflow_location = iVar12 + 0x10;
      bVar6 = true;
      lVar13 = 0;
LAB_00113054:
      do {
        iVar12 = bucket.overflow_location;
        if (!bVar6) {
          bVar5 = uVar9 == 0;
          goto LAB_0011315c;
        }
        pFVar3 = (FILE *)linear_hash->database;
        *(undefined8 *)((long)__s + -8) = 0x11306e;
        fseek(pFVar3,iVar12,0);
        iVar8 = linear_hash->records_per_bucket;
        sVar11 = linear_hash->record_total_size;
        pFVar3 = (FILE *)linear_hash->database;
        *(undefined8 *)((long)__s + -8) = 0x113086;
        fread(__s,sVar11,(long)iVar8,pFVar3);
        for (iVar8 = 0; iVar8 < linear_hash->records_per_bucket; iVar8 = iVar8 + 1) {
          iVar1 = (linear_hash->super).record.key_size;
          cVar7 = *(char *)((long)__s + lVar13);
          *(undefined8 *)((long)__s + -8) = 0x1130bb;
          memcpy(__dest,(char *)((long)__s + lVar13) + 1,(long)iVar1);
          iVar2 = (linear_hash->super).record.value_size;
          *(undefined8 *)((long)__s + -8) = 0x1130d0;
          memcpy(__dest_00,(void *)((long)__s + iVar1 + lVar13 + 1),(long)iVar2);
          if (cVar7 != '\0') {
            p_Var4 = (linear_hash->super).compare;
            *(undefined8 *)((long)__s + -8) = 0x1130e5;
            cVar7 = (*p_Var4)(__dest,key,iVar1);
            if (cVar7 == '\0') {
              uVar9 = uVar9 + 1;
              iVar8 = (linear_hash->super).record.value_size;
              *(undefined8 *)((long)__s + -8) = 0x113124;
              memcpy(value,__dest_00,(long)iVar8);
              bVar6 = false;
              goto LAB_00113054;
            }
          }
          lVar13 = lVar13 + linear_hash->record_total_size;
        }
        bVar6 = false;
      } while (bucket_loc == -1);
      *(undefined8 *)((long)__s + -8) = 0x113145;
      bVar5 = linear_hash_get_bucket(bucket_loc,(linear_hash_bucket_t *)local_90,linear_hash);
      iVar12 = bucket_loc;
    } while (bVar5 == 0);
LAB_0011315c:
    uVar10 = (ulong)uVar9 << 0x20;
  }
  else {
    uVar10 = 0;
  }
  return (ion_status_t)(bVar5 | uVar10);
}

Assistant:

ion_status_t
linear_hash_get(
	ion_byte_t			*key,
	ion_byte_t			*value,
	linear_hash_table_t *linear_hash
) {
	/* status for result count */
	ion_status_t status = ION_STATUS_INITIALIZE;
	/* get the index of the bucket to read */
	int bucket_idx		= insert_hash_to_bucket(key, linear_hash);

	if (bucket_idx < linear_hash->next_split) {
		bucket_idx = hash_to_bucket(key, linear_hash);
	}

	/* get the bucket where the record would be located */
	ion_fpos_t				bucket_loc = bucket_idx_to_ion_fpos_t(bucket_idx, linear_hash);
	linear_hash_bucket_t	bucket;

	status.error = linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

	if (status.error != err_ok) {
		return status;
	}

	/* create a linear_hash_record with the desired key, value, and status of full*/
	ion_byte_t	*record_key		= alloca(linear_hash->super.record.key_size);
	ion_byte_t	*record_value	= alloca(linear_hash->super.record.value_size);
	ion_byte_t	record_status	= linear_hash_record_status_empty;

	int found					= boolean_false;
	int i;

	ion_byte_t *records			= alloca(linear_hash->record_total_size * linear_hash->records_per_bucket);

	memset(records, 0, linear_hash->record_total_size * linear_hash->records_per_bucket);

	ion_fpos_t		record_offset	= 0;
	ion_fpos_t		record_loc;
	ion_boolean_t	terminal		= boolean_false;

	while (terminal == boolean_false && found == boolean_false) {
		record_loc = bucket_loc + sizeof(linear_hash_bucket_t);
		fseek(linear_hash->database, bucket_loc + sizeof(linear_hash_bucket_t), SEEK_SET);
		fread(records, linear_hash->record_total_size, linear_hash->records_per_bucket, linear_hash->database);

		for (i = 0; i < linear_hash->records_per_bucket; i++) {
			memcpy(&record_status, records + record_offset, sizeof(record_status));
			memcpy(record_key, records + record_offset + sizeof(record_status), linear_hash->super.record.key_size);
			memcpy(record_value, records + record_offset + sizeof(record_status) + linear_hash->super.record.key_size, linear_hash->super.record.value_size);

			if (record_status != 0) {
				if (linear_hash->super.compare(record_key, key, linear_hash->super.record.key_size) == 0) {
					status.count++;
					memcpy(value, record_value, linear_hash->super.record.value_size);
					found = 1;
					break;
				}
			}

			record_offset	+= linear_hash->record_total_size;
			record_loc		+= linear_hash->record_total_size;
		}

		if (found == boolean_false) {
			if (bucket.overflow_location == linear_hash_end_of_list) {
				terminal = boolean_true;
			}
			else {
				record_offset	= 0;
				bucket_loc		= bucket.overflow_location;
				status.error	= linear_hash_get_bucket(bucket_loc, &bucket, linear_hash);

				if (status.error != err_ok) {
					return status;
				}
			}
		}
	}

	if (status.count == 0) {
		status.error = err_item_not_found;
	}
	else {
		status.error = err_ok;
	}

	return status;
}